

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawhelper.cpp
# Opt level: O0

bool blend_vertical_gradient_argb(int count,QT_FT_Span *spans,void *userData)

{
  int iVar1;
  CompositionFunctionSolid p_Var2;
  bool bVar3;
  uchar *puVar4;
  QSpanData *in_RDX;
  QT_FT_Span *in_RSI;
  int in_EDI;
  long in_FS_OFFSET;
  quint32 color;
  quint32 *dst;
  int x;
  int y;
  CompositionFunctionSolid funcSolid;
  QSpanData *data;
  int off;
  int yinc;
  LinearGradientValues linear;
  int in_stack_ffffffffffffff8c;
  undefined4 in_stack_ffffffffffffff90;
  uint in_stack_ffffffffffffff94;
  QT_FT_Span *local_40;
  int local_38;
  bool local_31;
  int local_30 [2];
  LinearGradientValues local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_28.dx = -NAN;
  local_28.dy = -NAN;
  local_28.l = -NAN;
  local_28.off = -NAN;
  getLinearGradientValues(&local_28,in_RDX);
  p_Var2 = functionForModeSolid[in_RDX->rasterBuffer->compositionMode];
  local_30[1] = 0;
  local_30[0] = 0;
  bVar3 = calculate_fixed_gradient_factors(in_EDI,in_RSI,in_RDX,&local_28,local_30 + 1,local_30);
  local_40 = in_RSI;
  local_38 = in_EDI;
  if (bVar3) {
    while (local_38 != 0) {
      iVar1 = local_40->x;
      puVar4 = QRasterBuffer::scanLine(in_RDX->rasterBuffer,local_40->y);
      in_stack_ffffffffffffff94 =
           qt_gradient_pixel_fixed
                     ((QGradientData *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90)
                      ,in_stack_ffffffffffffff8c);
      (*p_Var2)((uint *)(puVar4 + (long)iVar1 * 4),local_40->len,in_stack_ffffffffffffff94,
                (uint)local_40->coverage);
      local_40 = local_40 + 1;
      local_38 = local_38 + -1;
    }
    local_31 = true;
  }
  else {
    local_31 = false;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_31;
}

Assistant:

static bool blend_vertical_gradient_argb(int count, const QT_FT_Span *spans, void *userData)
{
    QSpanData *data = reinterpret_cast<QSpanData *>(userData);

    LinearGradientValues linear;
    getLinearGradientValues(&linear, data);

    CompositionFunctionSolid funcSolid =
        functionForModeSolid[data->rasterBuffer->compositionMode];

    int yinc(0), off(0);
    if (!calculate_fixed_gradient_factors(count, spans, data, linear, &yinc, &off))
        return false;

    while (count--) {
        int y = spans->y;
        int x = spans->x;

        quint32 *dst = (quint32 *)(data->rasterBuffer->scanLine(y)) + x;
        quint32 color =
            qt_gradient_pixel_fixed(&data->gradient, yinc * y + off);

        funcSolid(dst, spans->len, color, spans->coverage);
        ++spans;
    }
    return true;
}